

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::EbmlElementSize(uint64 type,char *value)

{
  int32 iVar1;
  int32 iVar2;
  size_t sVar3;
  size_t value_00;
  char *in_RSI;
  uint64 in_RDI;
  uint64 ebml_size;
  undefined8 local_8;
  
  if (in_RSI == (char *)0x0) {
    local_8 = 0;
  }
  else {
    iVar1 = GetUIntSize(in_RDI);
    sVar3 = strlen(in_RSI);
    value_00 = strlen(in_RSI);
    iVar2 = GetCodedUIntSize(value_00);
    local_8 = (long)iVar2 + sVar3 + (long)iVar1;
  }
  return local_8;
}

Assistant:

uint64 EbmlElementSize(uint64 type, const char* value) {
  if (!value)
    return 0;

  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += strlen(value);

  // Size of Datasize
  ebml_size += GetCodedUIntSize(strlen(value));

  return ebml_size;
}